

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

int codepoint(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_Integer def;
  lua_Integer lVar3;
  char *s;
  size_t len;
  l_uint32 code;
  int local_44;
  ulong local_40;
  uint local_34;
  
  pcVar2 = luaL_checklstring(L,1,&local_40);
  def = luaL_optinteger(L,2,1);
  if (def < 0) {
    if (local_40 < (ulong)-def) {
      def = 0;
    }
    else {
      def = def + local_40 + 1;
    }
  }
  lVar3 = luaL_optinteger(L,3,def);
  if (lVar3 < 0) {
    if (local_40 < (ulong)-lVar3) {
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 + local_40 + 1;
    }
  }
  iVar1 = lua_toboolean(L,4);
  if (def < 1) {
    luaL_argerror(L,2,"out of bounds");
  }
  if ((long)local_40 < lVar3) {
    luaL_argerror(L,3,"out of bounds");
  }
  local_44 = 0;
  if (def <= lVar3) {
    if (lVar3 - def < 0x7fffffff) {
      luaL_checkstack(L,(int)(lVar3 - def) + 1,"string slice too long");
      s = pcVar2 + def + -1;
      local_44 = 0;
      while (s < pcVar2 + lVar3) {
        s = utf8_decode(s,&local_34,(uint)(iVar1 == 0));
        if (s == (char *)0x0) {
          iVar1 = luaL_error(L,"invalid UTF-8 code");
          return iVar1;
        }
        lua_pushinteger(L,(ulong)local_34);
        local_44 = local_44 + 1;
      }
    }
    else {
      local_44 = luaL_error(L,"string slice too long");
    }
  }
  return local_44;
}

Assistant:

static int codepoint (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer pose = u_posrelat(luaL_optinteger(L, 3, posi), len);
  int lax = lua_toboolean(L, 4);
  int n;
  const char *se;
  luaL_argcheck(L, posi >= 1, 2, "out of bounds");
  luaL_argcheck(L, pose <= (lua_Integer)len, 3, "out of bounds");
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (pose - posi >= INT_MAX)  /* (lua_Integer -> int) overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;  /* upper bound for number of returns */
  luaL_checkstack(L, n, "string slice too long");
  n = 0;  /* count the number of returns */
  se = s + pose;  /* string end */
  for (s += posi - 1; s < se;) {
    l_uint32 code;
    s = utf8_decode(s, &code, !lax);
    if (s == NULL)
      return luaL_error(L, MSGInvalid);
    lua_pushinteger(L, l_castU2S(code));
    n++;
  }
  return n;
}